

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O3

void __thiscall
sptk::reaper::EpochTracker::GetSymmetryStats
          (EpochTracker *this,vector<float,_std::allocator<float>_> *data,float *pos_rms,
          float *neg_rms,float *mean)

{
  pointer pfVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  float fVar9;
  double dVar10;
  
  pfVar1 = (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  uVar3 = (uint)((ulong)((long)(data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)pfVar1) >> 2);
  if ((int)uVar3 < 1) {
    *mean = 0.0 / (float)(int)uVar3;
  }
  else {
    fVar2 = 0.0;
    uVar5 = 0;
    do {
      fVar2 = fVar2 + pfVar1[uVar5];
      uVar5 = uVar5 + 1;
    } while ((uVar3 & 0x7fffffff) != uVar5);
    *mean = fVar2 / (float)(int)uVar3;
    if (0 < (int)uVar3) {
      uVar5 = 0;
      dVar7 = 0.0;
      iVar4 = 0;
      iVar6 = 0;
      dVar10 = 0.0;
      do {
        fVar9 = pfVar1[uVar5] - fVar2 / (float)(int)uVar3;
        dVar8 = (double)fVar9;
        if (fVar9 <= 0.0) {
          if (fVar9 < 0.0) {
            dVar10 = dVar10 + dVar8 * dVar8;
            iVar4 = iVar4 + 1;
          }
        }
        else {
          dVar7 = dVar7 + dVar8 * dVar8;
          iVar6 = iVar6 + 1;
        }
        uVar5 = uVar5 + 1;
      } while ((uVar3 & 0x7fffffff) != uVar5);
      dVar7 = dVar7 / (double)iVar6;
      dVar10 = dVar10 / (double)iVar4;
      goto LAB_0010ef09;
    }
  }
  dVar7 = NAN;
  dVar10 = NAN;
LAB_0010ef09:
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  *pos_rms = (float)dVar7;
  if (dVar10 < 0.0) {
    dVar10 = sqrt(dVar10);
  }
  else {
    dVar10 = SQRT(dVar10);
  }
  *neg_rms = (float)dVar10;
  return;
}

Assistant:

void EpochTracker::GetSymmetryStats(const std::vector<float>& data, float* pos_rms,
                                    float* neg_rms, float* mean) {
  int32_t n_input = data.size();
  double p_sum = 0.0;
  double n_sum = 0.0;
  double sum = 0.0;
  int32_t n_p = 0;
  int32_t n_n = 0;
  for (int32_t i = 0; i < n_input; ++i) {
    sum += data[i];
  }
  *mean = sum / n_input;
  for (int32_t i = 0; i < n_input; ++i) {
    double val = data[i] - *mean;
    if (val > 0.0) {
      p_sum += (val * val);
      n_p++;
    } else {
      if (val < 0.0) {
        n_sum += (val * val);
        n_n++;
      }
    }
  }
  *pos_rms = sqrt(p_sum / n_p);
  *neg_rms = sqrt(n_sum / n_n);
}